

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::MakeNamedMedium
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  Float startTime;
  FileLoc loc_00;
  Transform *pTVar4;
  iterator iVar5;
  mapped_type *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  ParameterDictionary dict;
  string ret;
  AnimatedTransform renderFromMedium;
  ParameterDictionary local_7f0;
  ParameterDictionary local_788;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_720;
  TransformedSceneEntity local_6c0;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  if (this->currentApiState == Uninitialized) {
    paVar1 = &local_6c0.super_SceneEntity.name.field_2;
    local_6c0.super_SceneEntity.name._M_string_length = 0;
    local_6c0.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
    local_6c0.super_SceneEntity.name._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<char_const(&)[16]>
              ((string *)&local_6c0,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"MakeNamedMedium");
    Error((FileLoc *)&params,local_6c0.super_SceneEntity.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0.super_SceneEntity.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_6c0.super_SceneEntity.name._M_dataplus._M_p,
                      CONCAT71(local_6c0.super_SceneEntity.name.field_2._M_allocated_capacity._1_7_,
                               local_6c0.super_SceneEntity.name.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pTVar4 = (this->curTransform).t + 1;
    bVar8 = true;
    uVar6 = 0;
    do {
      lVar7 = 0;
      do {
        fVar2 = (pTVar4->m).m[0][lVar7];
        fVar3 = ((TransformSet *)(pTVar4 + -1))->t[0].m.m[0][lVar7];
        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
          if (bVar8) {
            paVar1 = &local_6c0.super_SceneEntity.name.field_2;
            local_6c0.super_SceneEntity.name._M_string_length = 0;
            local_6c0.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
            local_6c0.super_SceneEntity.name._M_dataplus._M_p = (pointer)paVar1;
            detail::stringPrintfRecursive<char_const(&)[16]>
                      ((string *)&local_6c0,
                       "Animated transformations set; ignoring for \"%s\" and using the start transform only"
                       ,(char (*) [16])"MakeNamedMedium");
            Warning((FileLoc *)&params,local_6c0.super_SceneEntity.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c0.super_SceneEntity.name._M_dataplus._M_p != paVar1) {
              operator_delete(local_6c0.super_SceneEntity.name._M_dataplus._M_p,
                              CONCAT71(local_6c0.super_SceneEntity.name.field_2.
                                       _M_allocated_capacity._1_7_,
                                       local_6c0.super_SceneEntity.name.field_2._M_local_buf[0]) + 1
                             );
            }
          }
          goto LAB_003abcd5;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      bVar8 = uVar6 < 3;
      uVar6 = uVar6 + 1;
      pTVar4 = (Transform *)((pTVar4->m).m + 1);
    } while (uVar6 != 4);
LAB_003abcd5:
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_720,in_RDX);
    ParameterDictionary::ParameterDictionary
              (&local_788,&local_720,&this->graphicsState->mediumAttributes,
               this->graphicsState->colorSpace);
    local_720.nStored = 0;
    (*(local_720.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_720.alloc.memoryResource,local_720.ptr,local_720.nAlloc << 3,8);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
            ::find(&(this->media)._M_t,name);
    if ((_Rb_tree_header *)iVar5._M_node == &(this->media)._M_t._M_impl.super__Rb_tree_header) {
      GetCTM((Transform *)&local_6c0,this,0);
      startTime = this->transformStartTime;
      GetCTM(&local_368,this,1);
      AnimatedTransform::AnimatedTransform
                (&local_2e8,(Transform *)&local_6c0,startTime,&local_368,this->transformEndTime);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_7f0.params,&local_788.params);
      local_7f0.colorSpace = local_788.colorSpace;
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      TransformedSceneEntity::TransformedSceneEntity(&local_6c0,name,&local_7f0,loc_00,&local_2e8);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                ::operator[](&this->media,name);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_6c0);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::operator=(&(this_00->super_SceneEntity).parameters.params,
                  &local_6c0.super_SceneEntity.parameters.params);
      (this_00->super_SceneEntity).parameters.colorSpace =
           local_6c0.super_SceneEntity.parameters.colorSpace;
      (this_00->super_SceneEntity).loc.filename._M_len =
           local_6c0.super_SceneEntity.loc.filename._M_len;
      (this_00->super_SceneEntity).loc.filename._M_str =
           local_6c0.super_SceneEntity.loc.filename._M_str;
      (this_00->super_SceneEntity).loc.line = local_6c0.super_SceneEntity.loc.line;
      (this_00->super_SceneEntity).loc.column = local_6c0.super_SceneEntity.loc.column;
      memcpy(&this_00->renderFromObject,&local_6c0.renderFromObject,0x2b8);
      local_6c0.super_SceneEntity.parameters.params.nStored = 0;
      (*(local_6c0.super_SceneEntity.parameters.params.alloc.memoryResource)->_vptr_memory_resource
        [3])(local_6c0.super_SceneEntity.parameters.params.alloc.memoryResource,
             local_6c0.super_SceneEntity.parameters.params.ptr,
             local_6c0.super_SceneEntity.parameters.params.nAlloc << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.super_SceneEntity.name._M_dataplus._M_p !=
          &local_6c0.super_SceneEntity.name.field_2) {
        operator_delete(local_6c0.super_SceneEntity.name._M_dataplus._M_p,
                        CONCAT71(local_6c0.super_SceneEntity.name.field_2._M_allocated_capacity.
                                 _1_7_,local_6c0.super_SceneEntity.name.field_2._M_local_buf[0]) + 1
                       );
      }
      local_7f0.params.nStored = 0;
      (*(local_7f0.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_7f0.params.alloc.memoryResource,local_7f0.params.ptr,
                 local_7f0.params.nAlloc << 3,8);
    }
    else {
      SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                (&this->super_SceneRepresentation,(FileLoc *)&params,
                 "Named medium \"%s\" redefined.",name);
    }
    local_788.params.nStored = 0;
    (*(local_788.params.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_788.params.alloc.memoryResource,local_788.params.ptr,
               local_788.params.nAlloc << 3,8);
  }
  return;
}

Assistant:

void ParsedScene::MakeNamedMedium(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_INITIALIZED("MakeNamedMedium");
    WARN_IF_ANIMATED_TRANSFORM("MakeNamedMedium");
    ParameterDictionary dict(std::move(params), graphicsState->mediumAttributes,
                             graphicsState->colorSpace);

    if (media.find(name) != media.end()) {
        ErrorExitDeferred(&loc, "Named medium \"%s\" redefined.", name);
        return;
    }

    AnimatedTransform renderFromMedium(GetCTM(0), transformStartTime, GetCTM(1),
                                       transformEndTime);

    media[name] = TransformedSceneEntity(name, std::move(dict), loc, renderFromMedium);
}